

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExitNode.cpp
# Opt level: O0

void __thiscall ExitNode::ExitNode(ExitNode *this)

{
  Instruction *in_RDI;
  Node *unaff_retaddr;
  CallInst *in_stack_ffffffffffffffe8;
  
  Node::Node(unaff_retaddr,(NodeType)((ulong)in_RDI >> 0x20),in_RDI,in_stack_ffffffffffffffe8);
  *(undefined ***)in_RDI = &PTR__ExitNode_001cdbe0;
  std::set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_>::set
            ((set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_> *)0x191373);
  return;
}

Assistant:

ExitNode::ExitNode() : Node(NodeType::EXIT) {}